

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O3

void Ccf_ManStop(Ccf_Man_t *p)

{
  Vec_Int_t *__ptr;
  int *__ptr_00;
  
  __ptr = p->vCopies;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  Gia_ManUnrollStop(p->pUnr);
  sat_solver_delete(p->pSat);
  Gia_ManStopP(&p->pFrames);
  free(p);
  return;
}

Assistant:

void Ccf_ManStop( Ccf_Man_t * p )
{
    Vec_IntFree( p->vCopies );
    Gia_ManUnrollStop( p->pUnr );
    sat_solver_delete( p->pSat );
    Gia_ManStopP( &p->pFrames );
    ABC_FREE( p );
}